

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void dwt1(wt_object wt,double *sig,int len_sig,double *cA,double *cD)

{
  wave_object pwVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  conv_object pcVar7;
  char *__format;
  double *x;
  int iVar8;
  double *local_50;
  double *local_40;
  
  iVar6 = wt->wave->lpd_len;
  iVar8 = wt->wave->hpd_len + iVar6;
  iVar2 = strcmp(wt->ext,"per");
  if (iVar2 == 0) {
    iVar2 = iVar8 / 2;
    local_50 = (double *)malloc((long)(len_sig % 2 + len_sig + iVar2) << 3);
    iVar6 = iVar8 + 3;
    if (-1 < iVar8) {
      iVar6 = iVar8;
    }
    iVar3 = per_ext(sig,len_sig,iVar6 >> 2,local_50);
    iVar4 = iVar3 + iVar2;
    pwVar1 = wt->wave;
    iVar6 = pwVar1->lpd_len;
    local_40 = (double *)malloc((long)(iVar4 + iVar6 + -1) << 3);
    iVar8 = pwVar1->hpd_len;
    if (iVar6 == iVar8) {
      iVar5 = strcmp(wt->cmethod,"fft");
      if ((iVar5 == 0) || (iVar5 = strcmp(wt->cmethod,"FFT"), iVar5 == 0)) {
        pcVar7 = conv_init(iVar4,iVar6);
        wt->cobj = pcVar7;
        wt->cfftset = 1;
      }
      else if (iVar6 != iVar8) goto LAB_001032af;
      wconv(wt,local_50,iVar4,wt->wave->lpd,wt->wave->lpd_len,local_40);
      x = local_40 + iVar2;
      downsamp(x,iVar3,2,cA);
      wconv(wt,local_50,iVar4,wt->wave->hpd,wt->wave->hpd_len,local_40);
LAB_00103340:
      downsamp(x,iVar3,2,cD);
      if (wt->wave->lpd_len == wt->wave->hpd_len) {
        iVar6 = strcmp(wt->cmethod,"fft");
        if ((iVar6 == 0) || (iVar6 = strcmp(wt->cmethod,"FFT"), iVar6 == 0)) {
          free_conv(wt->cobj);
          wt->cfftset = 0;
        }
      }
      free(local_50);
      free(local_40);
      return;
    }
  }
  else {
    iVar2 = strcmp(wt->ext,"sym");
    if (iVar2 != 0) {
      __format = "Signal extension can be either per or sym";
      goto LAB_001033ba;
    }
    local_50 = (double *)malloc((long)(len_sig + iVar6 * 2 + -2) << 3);
    iVar3 = symm_ext(sig,len_sig,iVar6 + -1,local_50);
    local_40 = (double *)malloc((long)((iVar6 + -1) * 3 + iVar3) << 3);
    iVar2 = wt->wave->lpd_len;
    iVar8 = wt->wave->hpd_len;
    if (iVar2 == iVar8) {
      iVar4 = iVar6 * 2 + -2;
      iVar5 = strcmp(wt->cmethod,"fft");
      if ((iVar5 == 0) || (iVar5 = strcmp(wt->cmethod,"FFT"), iVar5 == 0)) {
        pcVar7 = conv_init(iVar3 + iVar4,iVar6);
        wt->cobj = pcVar7;
        wt->cfftset = 1;
      }
      else if (iVar2 != iVar8) goto LAB_001032af;
      iVar4 = iVar4 + iVar3;
      wconv(wt,local_50,iVar4,wt->wave->lpd,wt->wave->lpd_len,local_40);
      x = local_40 + iVar6;
      iVar3 = iVar6 + iVar3 + -2;
      downsamp(x,iVar3,2,cA);
      wconv(wt,local_50,iVar4,wt->wave->hpd,wt->wave->hpd_len,local_40);
      goto LAB_00103340;
    }
  }
LAB_001032af:
  __format = "Decomposition Filters must have the same length.";
LAB_001033ba:
  printf(__format);
  exit(-1);
}

Assistant:

static void dwt1(wt_object wt,double *sig,int len_sig, double *cA, double *cD) {
	int len_avg,D,lf;
	double *signal,*cA_undec;
	len_avg = (wt->wave->lpd_len + wt->wave->hpd_len) / 2;
	//len_sig = 2 * (int)ceil((double)len_sig / 2.0);

	D = 2;

	if (!strcmp(wt->ext, "per")) {
		signal = (double*)malloc(sizeof(double)* (len_sig + len_avg + (len_sig % 2)));

		len_sig = per_ext(sig, len_sig, len_avg / 2, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + len_avg + wt->wave->lpd_len - 1));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + len_avg, wt->wave->lpd_len);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}

		wconv(wt, signal, len_sig + len_avg, wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cA);

		wconv(wt, signal, len_sig + len_avg, wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + len_avg, len_sig, D, cD);
	}
	else if (!strcmp(wt->ext, "sym")) {
		//printf("\n YES %s \n", wt->ext);
		lf = wt->wave->lpd_len;// lpd and hpd have the same length

		signal = (double*)malloc(sizeof(double)* (len_sig + 2 * (lf - 1)));

		len_sig = symm_ext(sig, len_sig, lf - 1, signal);

		cA_undec = (double*)malloc(sizeof(double)* (len_sig + 3 * (lf - 1)));

		if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
			wt->cobj = conv_init(len_sig + 2 * (lf - 1), lf);
			wt->cfftset = 1;
		}
		else if (!(wt->wave->lpd_len == wt->wave->hpd_len)) {
			printf("Decomposition Filters must have the same length.");
			exit(-1);
		}


		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->lpd, wt->wave->lpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cA);

		wconv(wt, signal, len_sig + 2 * (lf - 1), wt->wave->hpd, wt->wave->hpd_len, cA_undec);

		downsamp(cA_undec + lf, len_sig + lf - 2, D, cD);
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}


	if (wt->wave->lpd_len == wt->wave->hpd_len && (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT"))) {
		free_conv(wt->cobj);
		wt->cfftset = 0;
	}

	free(signal);
	free(cA_undec);
}